

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressBlock_deprecated
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  size_t sVar1;
  size_t in_RDX;
  void *in_RSI;
  ZSTD_DCtx *in_RDI;
  size_t dSize;
  int in_stack_00000054;
  size_t in_stack_00000058;
  void *in_stack_00000060;
  size_t in_stack_00000068;
  void *in_stack_00000070;
  ZSTD_DCtx *in_stack_00000078;
  streaming_operation in_stack_00000090;
  
  ZSTD_checkContinuity(in_RDI,in_RSI,in_RDX);
  sVar1 = ZSTD_decompressBlock_internal
                    (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                     in_stack_00000058,in_stack_00000054,in_stack_00000090);
  in_RDI->previousDstEnd = (void *)((long)in_RSI + sVar1);
  return sVar1;
}

Assistant:

size_t ZSTD_decompressBlock_deprecated(ZSTD_DCtx* dctx,
                                       void* dst, size_t dstCapacity,
                                 const void* src, size_t srcSize)
{
    size_t dSize;
    ZSTD_checkContinuity(dctx, dst, dstCapacity);
    dSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 0, not_streaming);
    dctx->previousDstEnd = (char*)dst + dSize;
    return dSize;
}